

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O2

bool checkXdgRuntimeDir(QString *xdgRuntimeDir)

{
  bool bVar1;
  __uid_t _Var2;
  int iVar3;
  int *piVar4;
  ushort *puVar5;
  QFileSystemMetaData *metaData;
  QFileSystemMetaData *metaData_00;
  char *pcVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  QArrayDataPointer<char> local_f0;
  QArrayDataPointer<char> local_d8;
  QMessageLogger local_c0;
  QFileSystemMetaData local_a0;
  undefined1 local_68 [64];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = geteuid();
  local_a0.knownFlagsMask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  local_a0.entryFlags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  local_a0.size_ = -1;
  local_a0.accessTime_ = 0;
  local_a0.birthTime_ = 0;
  local_a0.metadataChangeTime_ = 0;
  local_a0.modificationTime_ = 0;
  local_a0.userId_ = 0xfffffffe;
  local_a0.groupId_ = 0xfffffffe;
  local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68,xdgRuntimeDir);
  QFileSystemEntry::nativeFilePath((NativePath *)&local_c0,(QFileSystemEntry *)local_68);
  pcVar6 = (char *)CONCAT44(local_c0.context.file._4_4_,local_c0.context.file._0_4_);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = &QByteArray::_empty;
  }
  iVar3 = mkdir(pcVar6,0x1c0);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c0);
  bVar7 = true;
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    if (*piVar4 == 0x11) {
      bVar1 = QFileSystemEngine::fillMetaData
                        ((QFileSystemEntry *)local_68,&local_a0,(MetaDataFlags)0x72a77077);
      if (bVar1 || (local_a0._0_8_ & 0x1000000000000) != 0) {
        if (((uint)local_a0.entryFlags.
                   super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x50000) == 0x40000) {
          if (local_a0.userId_ == _Var2) {
            if (((uint)local_a0.entryFlags.
                       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x7777) == 0x7000)
            goto LAB_003e8209;
            local_c0.context.version = 2;
            local_c0.context.function._4_4_ = 0;
            local_c0.context.line = 0;
            local_c0.context.file._0_4_ = 0;
            local_c0.context.file._4_4_ = 0;
            local_c0.context.function._0_4_ = 0;
            local_c0.context.category = "default";
            puVar5 = QString::utf16(xdgRuntimeDir);
            unixPermissionsText((QByteArray *)&local_d8,
                                (Permissions)
                                ((uint)local_a0.entryFlags.
                                       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
                                       .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
                                0x7777));
            unixPermissionsText((QByteArray *)&local_f0,(Permissions)0x7000);
            if (local_d8.ptr == (char *)0x0) {
              local_d8.ptr = &QByteArray::_empty;
            }
            if (local_f0.ptr == (char *)0x0) {
              local_f0.ptr = &QByteArray::_empty;
            }
            QMessageLogger::warning
                      (&local_c0,
                       "QStandardPaths: wrong permissions on runtime directory %ls, %s instead of %s"
                       ,puVar5,local_d8.ptr,local_f0.ptr);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_f0);
          }
          else {
            local_c0.context.version = 2;
            local_c0.context.function._4_4_ = 0;
            local_c0.context.line = 0;
            local_c0.context.file._0_4_ = 0;
            local_c0.context.file._4_4_ = 0;
            local_c0.context.function._0_4_ = 0;
            local_c0.context.category = "default";
            puVar5 = QString::utf16(xdgRuntimeDir);
            checkXdgRuntimeDir::anon_class_1_0_00000001::operator()
                      ((QByteArray *)&local_d8,(anon_class_1_0_00000001 *)&local_a0,metaData_00);
            if (local_d8.ptr == (char *)0x0) {
              local_d8.ptr = &QByteArray::_empty;
            }
            QMessageLogger::warning
                      (&local_c0,
                       "QStandardPaths: runtime directory \'%ls\' is not owned by UID %d, but %s",
                       puVar5,(ulong)_Var2,local_d8.ptr);
          }
        }
        else {
          local_c0.context.version = 2;
          local_c0.context.function._4_4_ = 0;
          local_c0.context.line = 0;
          local_c0.context.file._0_4_ = 0;
          local_c0.context.file._4_4_ = 0;
          local_c0.context.function._0_4_ = 0;
          local_c0.context.category = "default";
          puVar5 = QString::utf16(xdgRuntimeDir);
          checkXdgRuntimeDir::anon_class_1_0_00000001::operator()
                    ((QByteArray *)&local_d8,(anon_class_1_0_00000001 *)&local_a0,metaData);
          if (local_d8.ptr == (char *)0x0) {
            local_d8.ptr = &QByteArray::_empty;
          }
          QMessageLogger::warning
                    (&local_c0,
                     "QStandardPaths: runtime directory \'%ls\' is not a directory, but %s",puVar5,
                     local_d8.ptr);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
        bVar7 = false;
        goto LAB_003e8209;
      }
      puVar5 = QString::utf16(xdgRuntimeDir);
      pcVar6 = "QStandardPaths: error obtaining permissions of runtime directory \'%ls\'";
    }
    else {
      puVar5 = QString::utf16(xdgRuntimeDir);
      pcVar6 = "QStandardPaths: error creating runtime directory \'%ls\'";
    }
    bVar7 = false;
    qErrnoWarning(pcVar6,puVar5);
  }
LAB_003e8209:
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

static bool checkXdgRuntimeDir(const QString &xdgRuntimeDir)
{
    auto describeMetaData = [](const QFileSystemMetaData &metaData) -> QByteArray {
        if (!metaData.exists())
            return "a broken symlink";

        QByteArray description;
        if (metaData.isLink())
            description = "a symbolic link to ";

        if (metaData.isFile())
            description += "a regular file";
        else if (metaData.isDirectory())
            description += "a directory";
        else if (metaData.isSequential())
            description += "a character device, socket or FIFO";
        else
            description += "a block device";

        description += " permissions " + unixPermissionsText(metaData.permissions());

        return description
                + " owned by UID " + QByteArray::number(metaData.userId())
                + " GID " + QByteArray::number(metaData.groupId());
    };

    // http://standards.freedesktop.org/basedir-spec/latest/
    const uint myUid = uint(geteuid());
    const QFile::Permissions wantedPerms = QFile::ReadOwner | QFile::WriteOwner | QFile::ExeOwner;
    const QFileSystemMetaData::MetaDataFlags statFlags = QFileSystemMetaData::PosixStatFlags
                                                         | QFileSystemMetaData::LinkType;
    QFileSystemMetaData metaData;
    QFileSystemEntry entry(xdgRuntimeDir);

    // Check that the xdgRuntimeDir is a directory by attempting to create it.
    // A stat() before mkdir() that concluded it doesn't exist is a meaningless
    // result: we'd race against someone else attempting to create it.
    // ### QFileSystemEngine::createDirectory cannot take the extra mode argument.
    if (QT_MKDIR(entry.nativeFilePath(), 0700) == 0)
        return true;
    if (errno != EEXIST) {
        qErrnoWarning("QStandardPaths: error creating runtime directory '%ls'",
                      qUtf16Printable(xdgRuntimeDir));
        return false;
    }

    // We use LinkType to force an lstat(), but fillMetaData() still returns error
    // on broken symlinks.
    if (!QFileSystemEngine::fillMetaData(entry, metaData, statFlags) && !metaData.isLink()) {
        qErrnoWarning("QStandardPaths: error obtaining permissions of runtime directory '%ls'",
                      qUtf16Printable(xdgRuntimeDir));
        return false;
    }

    // Checks:
    // - is a directory
    // - is not a symlink (even is pointing to a directory)
    if (metaData.isLink() || !metaData.isDirectory()) {
        qWarning("QStandardPaths: runtime directory '%ls' is not a directory, but %s",
                 qUtf16Printable(xdgRuntimeDir), describeMetaData(metaData).constData());
        return false;
    }

    // - "The directory MUST be owned by the user"
    if (metaData.userId() != myUid) {
        qWarning("QStandardPaths: runtime directory '%ls' is not owned by UID %d, but %s",
                 qUtf16Printable(xdgRuntimeDir), myUid, describeMetaData(metaData).constData());
        return false;
    }

    // "and he MUST be the only one having read and write access to it. Its Unix access mode MUST be 0700."
    if (metaData.permissions() != wantedPerms) {
        qWarning("QStandardPaths: wrong permissions on runtime directory %ls, %s instead of %s",
                 qUtf16Printable(xdgRuntimeDir),
                 unixPermissionsText(metaData.permissions()).constData(),
                 unixPermissionsText(wantedPerms).constData());
        return false;
    }

    return true;
}